

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint16_t sub16_sat(uint16_t a,uint16_t b)

{
  ushort local_e;
  uint16_t res;
  uint16_t b_local;
  uint16_t a_local;
  
  local_e = a - b;
  if ((((local_e ^ a) & 0x8000) != 0) && (((a ^ b) & 0x8000) != 0)) {
    if ((a & 0x8000) == 0) {
      local_e = 0x7fff;
    }
    else {
      local_e = 0x8000;
    }
  }
  return local_e;
}

Assistant:

static inline uint16_t sub16_sat(uint16_t a, uint16_t b)
{
    uint16_t res;

    res = a - b;
    if (((res ^ a) & 0x8000) && ((a ^ b) & 0x8000)) {
        if (a & 0x8000)
            res = 0x8000;
        else
            res = 0x7fff;
    }
    return res;
}